

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O0

int __thiscall ncnn::Normalize::forward_inplace(Normalize *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float *pfVar2;
  long *in_RSI;
  long in_RDI;
  double dVar3;
  int i_8;
  float scale_4;
  float *ptr_7;
  int q_8;
  float a_3;
  float *ptr_6;
  int q_7;
  float ssum_4;
  int i_7;
  int i_6;
  float *ptr_5;
  int q_6;
  float a_2;
  float *ptr_4;
  int q_5;
  float ssum_3;
  int i_5;
  float scale_3;
  Mat square_sum_blob_1;
  int i_4;
  float scale_2;
  float a_1;
  int i_3;
  float ssum_2;
  float *ptr_3;
  int q_4;
  int i_2;
  float scale_1;
  float *ptr_2;
  int q_3;
  int i_1;
  float *ptr_1;
  int q_2;
  float scale;
  float a;
  int q_1;
  float ssum;
  int i;
  float ssum_1;
  float *ptr;
  int q;
  Mat square_sum_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  undefined4 in_stack_fffffffffffff1e8;
  undefined4 in_stack_fffffffffffff1ec;
  size_t in_stack_fffffffffffff1f0;
  undefined8 in_stack_fffffffffffff1f8;
  int _w;
  Mat *in_stack_fffffffffffff200;
  float local_ce0;
  int local_bb0;
  undefined8 local_ba8;
  undefined8 local_ba0;
  undefined8 local_b98;
  undefined4 local_b90;
  long local_b88;
  undefined4 local_b80;
  undefined4 local_b7c;
  undefined4 local_b78;
  undefined4 local_b74;
  undefined4 local_b70;
  undefined8 local_b68;
  long local_b60;
  int local_b54;
  float local_b50;
  float local_b4c;
  undefined8 local_b48;
  undefined8 local_b40;
  undefined8 local_b38;
  undefined4 local_b30;
  long local_b28;
  undefined4 local_b20;
  undefined4 local_b1c;
  undefined4 local_b18;
  undefined4 local_b14;
  undefined4 local_b10;
  undefined8 local_b08;
  long local_b00;
  int local_af8;
  float local_af4;
  int local_af0;
  int local_aec;
  undefined8 local_ae8;
  undefined8 local_ae0;
  undefined8 local_ad8;
  undefined4 local_ad0;
  long local_ac8;
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined4 local_ab0;
  undefined8 local_aa8;
  long local_aa0;
  int local_a94;
  float local_a90;
  float local_a8c;
  undefined8 local_a88;
  undefined8 local_a80;
  undefined8 local_a78;
  undefined4 local_a70;
  long local_a68;
  undefined4 local_a60;
  undefined4 local_a5c;
  undefined4 local_a58;
  undefined4 local_a54;
  undefined4 local_a50;
  undefined8 local_a48;
  long local_a40;
  int local_a38;
  float local_a34;
  int local_a30;
  float local_a2c;
  void *local_a28;
  int *local_a20;
  undefined8 local_a18;
  undefined4 local_a10;
  long *local_a08;
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  int local_9f0;
  long local_9e8;
  int local_9e0;
  float local_9dc;
  float local_9d8;
  float local_9d4;
  int local_9d0;
  float local_9cc;
  undefined8 local_9c8;
  undefined8 local_9c0;
  undefined8 local_9b8;
  undefined4 local_9b0;
  long local_9a8;
  undefined4 local_9a0;
  undefined4 local_99c;
  undefined4 local_998;
  undefined4 local_994;
  undefined4 local_990;
  undefined8 local_988;
  long local_980;
  int local_974;
  int local_970;
  float local_96c;
  undefined8 local_968;
  undefined8 local_960;
  undefined8 local_958;
  undefined4 local_950;
  long local_948;
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined8 local_928;
  long local_920;
  int local_918;
  int local_914;
  undefined8 local_910;
  undefined8 local_908;
  undefined8 local_900;
  undefined4 local_8f8;
  long local_8f0;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  undefined4 local_8dc;
  undefined4 local_8d8;
  undefined8 local_8d0;
  long local_8c8;
  int local_8c0;
  float local_8bc;
  float local_8b8;
  float local_8b4;
  int local_8b0;
  float local_8ac;
  int local_8a8;
  float local_8a4;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_890;
  undefined4 local_888;
  long local_880;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  undefined8 local_860;
  long local_858;
  int local_84c;
  undefined4 local_848;
  void *local_838;
  int *local_830;
  undefined8 local_828;
  undefined4 local_820;
  long *local_818;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined4 local_804;
  int local_800;
  long local_7f8;
  int local_7ec;
  long local_7e8;
  int local_7dc;
  int local_7d8;
  int local_7d4;
  long *local_7c8;
  int local_7b4;
  void **local_7b0;
  void **local_7a8;
  undefined8 *local_7a0;
  undefined8 *local_790;
  undefined8 *local_780;
  void **local_770;
  undefined8 *local_760;
  undefined8 *local_750;
  undefined8 *local_740;
  undefined8 *local_730;
  undefined8 *local_720;
  void **local_710;
  void **local_700;
  void **local_6f8;
  undefined1 local_6ed;
  int local_6ec;
  undefined8 *local_6e0;
  undefined1 local_6cd;
  int local_6cc;
  undefined8 *local_6c0;
  undefined1 local_6ad;
  int local_6ac;
  undefined8 *local_6a0;
  undefined1 local_68d;
  int local_68c;
  undefined8 *local_680;
  undefined1 local_66d;
  int local_66c;
  undefined8 *local_660;
  undefined1 local_64d;
  int local_64c;
  undefined8 *local_640;
  undefined1 local_62d;
  int local_62c;
  undefined8 *local_620;
  undefined1 local_60d;
  int local_60c;
  undefined8 *local_600;
  undefined8 *local_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  long local_5d8;
  void **local_5d0;
  long local_5c8;
  void **local_5c0;
  long local_5b8;
  void **local_5b0;
  long local_5a8;
  void **local_5a0;
  long local_598;
  void **local_590;
  long local_588;
  void **local_580;
  long local_578;
  long *local_570;
  undefined8 local_568;
  undefined8 *local_560;
  long local_558;
  long *local_550;
  undefined8 local_548;
  undefined8 *local_540;
  long local_538;
  long *local_530;
  undefined8 local_528;
  undefined8 *local_520;
  undefined8 *local_518;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined8 *local_4f8;
  int local_460;
  undefined4 local_45c;
  void **local_458;
  undefined8 *local_438;
  undefined8 *local_418;
  undefined8 *local_3f8;
  undefined8 *local_3d8;
  undefined8 *local_3b8;
  int local_3a0;
  undefined4 local_39c;
  void **local_398;
  undefined8 *local_378;
  undefined8 *local_358;
  undefined8 *local_338;
  void *local_300;
  void *local_2a0;
  void **local_250;
  void **local_248;
  long local_240;
  undefined4 local_234;
  long local_230;
  long local_228;
  undefined4 local_21c;
  int local_218;
  int local_214;
  undefined8 *local_210;
  long local_208;
  undefined4 local_1fc;
  long local_1f8;
  long local_1f0;
  undefined4 local_1e4;
  int local_1e0;
  int local_1dc;
  undefined8 *local_1d8;
  long local_1d0;
  undefined4 local_1c4;
  long local_1c0;
  long local_1b8;
  undefined4 local_1ac;
  int local_1a8;
  int local_1a4;
  undefined8 *local_1a0;
  long local_198;
  undefined4 local_18c;
  long local_188;
  long local_180;
  undefined4 local_174;
  int local_170;
  int local_16c;
  undefined8 *local_168;
  long local_160;
  undefined4 local_154;
  long local_150;
  long local_148;
  undefined4 local_13c;
  int local_138;
  int local_134;
  undefined8 *local_130;
  long local_128;
  undefined4 local_11c;
  long local_118;
  long local_110;
  undefined4 local_104;
  int local_100;
  int local_fc;
  undefined8 *local_f8;
  long local_f0;
  undefined4 local_e4;
  long local_e0;
  long local_d8;
  undefined4 local_cc;
  int local_c8;
  int local_c4;
  undefined8 *local_c0;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  long local_a0;
  undefined4 local_94;
  int local_90;
  int local_8c;
  undefined8 *local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_7d4 = *(int *)((long)in_RSI + 0x2c);
  local_7d8 = (int)in_RSI[6];
  local_7dc = (int)in_RSI[7];
  local_7e8 = in_RSI[2];
  local_7ec = local_7d4 * local_7d8;
  _w = (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20);
  local_7c8 = in_RSI;
  if ((*(int *)(in_RDI + 0xd0) == 0) || (*(int *)(in_RDI + 0xd4) == 0)) {
    if ((*(int *)(in_RDI + 0xd0) == 0) || (*(int *)(in_RDI + 0xd4) != 0)) {
      if ((*(int *)(in_RDI + 0xd0) == 0) && (*(int *)(in_RDI + 0xd4) != 0)) {
        local_7a8 = &local_a28;
        local_a28 = (void *)0x0;
        local_a20 = (int *)0x0;
        local_a18 = 0;
        local_a10 = 0;
        local_a08 = (long *)0x0;
        local_a00 = 0;
        local_9fc = 0;
        local_9f8 = 0;
        local_9f4 = 0;
        local_9f0 = 0;
        local_9e8 = 0;
        Mat::create(in_stack_fffffffffffff200,_w,in_stack_fffffffffffff1f0,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8));
        local_700 = &local_a28;
        if (local_a28 != (void *)0x0) {
          local_248 = local_700;
        }
        if (local_a28 != (void *)0x0 && local_9e8 * local_9f0 != 0) {
          if (*(int *)(in_RDI + 0xd8) == 0) {
            for (local_af0 = 0; local_af0 < local_7ec; local_af0 = local_af0 + 1) {
              local_af4 = 0.0;
              for (local_af8 = 0; local_af8 < local_7dc; local_af8 = local_af8 + 1) {
                local_6c0 = &local_b48;
                local_c4 = *(int *)((long)local_7c8 + 0x2c);
                local_c8 = (int)local_7c8[6];
                local_cc = *(undefined4 *)((long)local_7c8 + 0x34);
                local_b00 = *local_7c8 + local_7c8[8] * (long)local_af8 * local_7c8[2];
                local_e0 = local_7c8[2];
                local_e4 = (undefined4)local_7c8[3];
                local_f0 = local_7c8[4];
                local_c0 = &local_b48;
                local_68 = (long)local_c4 * (long)local_c8 * local_e0;
                local_6c = 0x10;
                local_6cc = local_af8;
                local_6cd = 1;
                local_5f0 = &local_b48;
                local_730 = &local_b48;
                local_b48 = 0;
                local_b38 = 0;
                local_b30 = 0;
                local_b20 = 0;
                local_b1c = 0;
                local_b18 = 0;
                local_b14 = 0;
                local_b10 = 0;
                local_b08 = 0;
                local_b40 = 0;
                local_af4 = *(float *)(local_b00 + (long)local_af0 * 4) *
                            *(float *)(local_b00 + (long)local_af0 * 4) + local_af4;
                local_418 = local_730;
                local_d8 = local_b00;
                local_b28 = local_f0;
              }
              if (*(int *)(in_RDI + 0xe4) == 0) {
                local_b4c = SQRT(local_af4 + *(float *)(in_RDI + 0xdc));
              }
              else if (*(int *)(in_RDI + 0xe4) == 1) {
                local_b50 = SQRT(local_af4);
                pfVar2 = std::max<float>(&local_b50,(float *)(in_RDI + 0xdc));
                local_b4c = *pfVar2;
              }
              else {
                pfVar2 = std::max<float>(&local_af4,(float *)(in_RDI + 0xdc));
                local_b4c = SQRT(*pfVar2);
              }
              local_b4c = 1.0 / local_b4c;
              local_5c8 = (long)local_af0;
              local_5c0 = &local_a28;
              *(float *)((long)local_a28 + local_5c8 * 4) = local_b4c;
            }
            for (local_b54 = 0; local_b54 < local_7dc; local_b54 = local_b54 + 1) {
              local_6e0 = &local_ba8;
              local_8c = *(int *)((long)local_7c8 + 0x2c);
              local_90 = (int)local_7c8[6];
              local_94 = *(undefined4 *)((long)local_7c8 + 0x34);
              local_b60 = *local_7c8 + local_7c8[8] * (long)local_b54 * local_7c8[2];
              local_a8 = local_7c8[2];
              local_ac = (undefined4)local_7c8[3];
              local_b8 = local_7c8[4];
              local_88 = &local_ba8;
              local_78 = (long)local_8c * (long)local_90 * local_a8;
              local_518 = &local_ba8;
              local_720 = &local_ba8;
              local_7c = 0x10;
              local_6ec = local_b54;
              local_6ed = 1;
              local_ba8 = 0;
              local_b98 = 0;
              local_b90 = 0;
              local_b80 = 0;
              local_b7c = 0;
              local_b78 = 0;
              local_b74 = 0;
              local_b70 = 0;
              local_b68 = 0;
              local_ba0 = 0;
              local_570 = (long *)(in_RDI + 0xe8);
              local_578 = (long)local_b54;
              fVar1 = *(float *)(*local_570 + local_578 * 4);
              for (local_bb0 = 0; local_bb0 < local_7ec; local_bb0 = local_bb0 + 1) {
                local_5d8 = (long)local_bb0;
                local_5d0 = &local_a28;
                *(float *)(local_b60 + (long)local_bb0 * 4) =
                     *(float *)(local_b60 + (long)local_bb0 * 4) *
                     *(float *)((long)local_a28 + local_5d8 * 4) * fVar1;
              }
              local_438 = local_720;
              local_a0 = local_b60;
              local_b88 = local_b8;
            }
          }
          else {
            local_560 = (undefined8 *)(in_RDI + 0xe8);
            local_568 = 0;
            local_a2c = *(float *)*local_560;
            for (local_a30 = 0; local_a30 < local_7ec; local_a30 = local_a30 + 1) {
              local_a34 = 0.0;
              for (local_a38 = 0; local_a38 < local_7dc; local_a38 = local_a38 + 1) {
                local_680 = &local_a88;
                local_134 = *(int *)((long)local_7c8 + 0x2c);
                local_138 = (int)local_7c8[6];
                local_13c = *(undefined4 *)((long)local_7c8 + 0x34);
                local_a40 = *local_7c8 + local_7c8[8] * (long)local_a38 * local_7c8[2];
                local_150 = local_7c8[2];
                local_154 = (undefined4)local_7c8[3];
                local_160 = local_7c8[4];
                local_130 = &local_a88;
                local_48 = (long)local_134 * (long)local_138 * local_150;
                local_4c = 0x10;
                local_68c = local_a38;
                local_68d = 1;
                local_5e8 = &local_a88;
                local_750 = &local_a88;
                local_a88 = 0;
                local_a78 = 0;
                local_a70 = 0;
                local_a60 = 0;
                local_a5c = 0;
                local_a58 = 0;
                local_a54 = 0;
                local_a50 = 0;
                local_a48 = 0;
                local_a80 = 0;
                local_a34 = *(float *)(local_a40 + (long)local_a30 * 4) *
                            *(float *)(local_a40 + (long)local_a30 * 4) + local_a34;
                local_3d8 = local_750;
                local_148 = local_a40;
                local_a68 = local_160;
              }
              if (*(int *)(in_RDI + 0xe4) == 0) {
                local_a8c = SQRT(local_a34 + *(float *)(in_RDI + 0xdc));
              }
              else if (*(int *)(in_RDI + 0xe4) == 1) {
                dVar3 = std::sqrt((double)(ulong)(uint)local_a34);
                local_a90 = SUB84(dVar3,0);
                pfVar2 = std::max<float>(&local_a90,(float *)(in_RDI + 0xdc));
                local_a8c = *pfVar2;
              }
              else {
                pfVar2 = std::max<float>(&local_a34,(float *)(in_RDI + 0xdc));
                local_a8c = SQRT(*pfVar2);
              }
              local_a8c = 1.0 / local_a8c;
              local_5a8 = (long)local_a30;
              local_5a0 = &local_a28;
              *(float *)((long)local_a28 + local_5a8 * 4) = local_a8c * local_a2c;
            }
            for (local_a94 = 0; local_a94 < local_7dc; local_a94 = local_a94 + 1) {
              local_6a0 = &local_ae8;
              local_fc = *(int *)((long)local_7c8 + 0x2c);
              local_100 = (int)local_7c8[6];
              local_104 = *(undefined4 *)((long)local_7c8 + 0x34);
              local_aa0 = *local_7c8 + local_7c8[8] * (long)local_a94 * local_7c8[2];
              local_118 = local_7c8[2];
              local_11c = (undefined4)local_7c8[3];
              local_128 = local_7c8[4];
              local_f8 = &local_ae8;
              local_58 = (long)local_fc * (long)local_100 * local_118;
              local_5c = 0x10;
              local_6ac = local_a94;
              local_6ad = 1;
              local_510 = &local_ae8;
              local_740 = &local_ae8;
              local_ae8 = 0;
              local_ad8 = 0;
              local_ad0 = 0;
              local_ac0 = 0;
              local_abc = 0;
              local_ab8 = 0;
              local_ab4 = 0;
              local_ab0 = 0;
              local_aa8 = 0;
              local_ae0 = 0;
              for (local_aec = 0; local_aec < local_7ec; local_aec = local_aec + 1) {
                local_5b8 = (long)local_aec;
                local_5b0 = &local_a28;
                *(float *)(local_aa0 + (long)local_aec * 4) =
                     *(float *)(local_aa0 + (long)local_aec * 4) *
                     *(float *)((long)local_a28 + local_5b8 * 4);
              }
              local_3f8 = local_740;
              local_110 = local_aa0;
              local_ac8 = local_128;
            }
          }
          local_7b4 = 0;
        }
        else {
          local_7b4 = -100;
        }
        local_848 = 1;
        local_710 = &local_a28;
        if (local_a20 != (int *)0x0) {
          local_45c = 0xffffffff;
          LOCK();
          local_460 = *local_a20;
          *local_a20 = *local_a20 + -1;
          UNLOCK();
          if (local_460 == 1) {
            local_458 = local_710;
            if (local_a08 == (long *)0x0) {
              local_2a0 = local_a28;
              if (local_a28 != (void *)0x0) {
                free(local_a28);
              }
            }
            else {
              (**(code **)(*local_a08 + 0x18))(local_a08,local_a28);
            }
          }
        }
      }
      else {
        local_7b4 = 0;
      }
    }
    else {
      for (local_974 = 0; local_974 < local_7dc; local_974 = local_974 + 1) {
        local_660 = &local_9c8;
        local_16c = *(int *)((long)local_7c8 + 0x2c);
        local_170 = (int)local_7c8[6];
        local_174 = *(undefined4 *)((long)local_7c8 + 0x34);
        local_980 = *local_7c8 + local_7c8[8] * (long)local_974 * local_7c8[2];
        local_188 = local_7c8[2];
        local_18c = (undefined4)local_7c8[3];
        local_198 = local_7c8[4];
        local_168 = &local_9c8;
        local_38 = (long)local_16c * (long)local_170 * local_188;
        local_508 = &local_9c8;
        local_760 = &local_9c8;
        local_3c = 0x10;
        local_66c = local_974;
        local_66d = 1;
        local_9c8 = 0;
        local_9b8 = 0;
        local_9b0 = 0;
        local_9a0 = 0;
        local_99c = 0;
        local_998 = 0;
        local_994 = 0;
        local_990 = 0;
        local_988 = 0;
        local_9c0 = 0;
        local_9cc = 0.0;
        for (local_9d0 = 0; local_9d0 < local_7ec; local_9d0 = local_9d0 + 1) {
          local_9cc = *(float *)(local_980 + (long)local_9d0 * 4) *
                      *(float *)(local_980 + (long)local_9d0 * 4) + local_9cc;
        }
        if (*(int *)(in_RDI + 0xe4) == 0) {
          local_9d4 = SQRT(local_9cc + *(float *)(in_RDI + 0xdc));
        }
        else {
          local_3b8 = local_760;
          local_180 = local_980;
          local_9a8 = local_198;
          if (*(int *)(in_RDI + 0xe4) == 1) {
            local_9d8 = SQRT(local_9cc);
            pfVar2 = std::max<float>(&local_9d8,(float *)(in_RDI + 0xdc));
            local_9d4 = *pfVar2;
          }
          else {
            pfVar2 = std::max<float>(&local_9cc,(float *)(in_RDI + 0xdc));
            local_9d4 = SQRT(*pfVar2);
          }
        }
        local_9d4 = 1.0 / local_9d4;
        if (*(int *)(in_RDI + 0xd8) == 0) {
          local_550 = (long *)(in_RDI + 0xe8);
          local_558 = (long)local_974;
          local_ce0 = *(float *)(*local_550 + local_558 * 4);
        }
        else {
          local_540 = (undefined8 *)(in_RDI + 0xe8);
          local_548 = 0;
          local_ce0 = *(float *)*local_540;
        }
        local_9dc = local_9d4 * local_ce0;
        for (local_9e0 = 0; local_9e0 < local_7ec; local_9e0 = local_9e0 + 1) {
          *(float *)(local_980 + (long)local_9e0 * 4) =
               *(float *)(local_980 + (long)local_9e0 * 4) * local_9dc;
        }
      }
      local_7b4 = 0;
    }
  }
  else {
    local_7b0 = &local_838;
    local_838 = (void *)0x0;
    local_830 = (int *)0x0;
    local_828 = 0;
    local_820 = 0;
    local_818 = (long *)0x0;
    local_810 = 0;
    local_80c = 0;
    local_808 = 0;
    local_804 = 0;
    local_800 = 0;
    local_7f8 = 0;
    Mat::create(in_stack_fffffffffffff200,_w,in_stack_fffffffffffff1f0,
                (Allocator *)CONCAT44(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8));
    local_6f8 = &local_838;
    if (local_838 != (void *)0x0) {
      local_250 = local_6f8;
    }
    if (local_838 != (void *)0x0 && local_7f8 * local_800 != 0) {
      for (local_84c = 0; local_84c < local_7dc; local_84c = local_84c + 1) {
        local_600 = &local_8a0;
        local_214 = *(int *)((long)local_7c8 + 0x2c);
        local_218 = (int)local_7c8[6];
        local_21c = *(undefined4 *)((long)local_7c8 + 0x34);
        local_858 = *local_7c8 + local_7c8[8] * (long)local_84c * local_7c8[2];
        local_230 = local_7c8[2];
        local_234 = (undefined4)local_7c8[3];
        local_240 = local_7c8[4];
        local_210 = &local_8a0;
        local_8 = (long)local_214 * (long)local_218 * local_230;
        local_c = 0x10;
        local_60c = local_84c;
        local_60d = 1;
        local_5e0 = &local_8a0;
        local_7a0 = &local_8a0;
        local_8a0 = 0;
        local_890 = 0;
        local_888 = 0;
        local_878 = 0;
        local_874 = 0;
        local_870 = 0;
        local_86c = 0;
        local_868 = 0;
        local_860 = 0;
        local_898 = 0;
        local_8a4 = 0.0;
        for (local_8a8 = 0; local_8a8 < local_7ec; local_8a8 = local_8a8 + 1) {
          local_8a4 = *(float *)(local_858 + (long)local_8a8 * 4) *
                      *(float *)(local_858 + (long)local_8a8 * 4) + local_8a4;
        }
        local_588 = (long)local_84c;
        local_580 = &local_838;
        *(float *)((long)local_838 + local_588 * 4) = local_8a4;
        local_338 = local_7a0;
        local_228 = local_858;
        local_880 = local_240;
      }
      local_8ac = 0.0;
      for (local_8b0 = 0; local_8b0 < local_7dc; local_8b0 = local_8b0 + 1) {
        local_598 = (long)local_8b0;
        local_590 = &local_838;
        local_8ac = *(float *)((long)local_838 + local_598 * 4) + local_8ac;
      }
      if (*(int *)(in_RDI + 0xe4) == 0) {
        local_8b4 = SQRT(local_8ac + *(float *)(in_RDI + 0xdc));
      }
      else if (*(int *)(in_RDI + 0xe4) == 1) {
        local_8b8 = SQRT(local_8ac);
        pfVar2 = std::max<float>(&local_8b8,(float *)(in_RDI + 0xdc));
        local_8b4 = *pfVar2;
      }
      else {
        pfVar2 = std::max<float>(&local_8ac,(float *)(in_RDI + 0xdc));
        dVar3 = std::sqrt((double)(ulong)(uint)*pfVar2);
        local_8b4 = SUB84(dVar3,0);
      }
      local_8b4 = 1.0 / local_8b4;
      if (*(int *)(in_RDI + 0xd8) == 0) {
        for (local_918 = 0; local_918 < local_7dc; local_918 = local_918 + 1) {
          local_640 = &local_968;
          local_1a4 = *(int *)((long)local_7c8 + 0x2c);
          local_1a8 = (int)local_7c8[6];
          local_1ac = *(undefined4 *)((long)local_7c8 + 0x34);
          local_920 = *local_7c8 + local_7c8[8] * (long)local_918 * local_7c8[2];
          local_1c0 = local_7c8[2];
          local_1c4 = (undefined4)local_7c8[3];
          local_1d0 = local_7c8[4];
          local_1a0 = &local_968;
          local_28 = (long)local_1a4 * (long)local_1a8 * local_1c0;
          local_2c = 0x10;
          local_64c = local_918;
          local_64d = 1;
          local_500 = &local_968;
          local_780 = &local_968;
          local_968 = 0;
          local_958 = 0;
          local_950 = 0;
          local_940 = 0;
          local_93c = 0;
          local_938 = 0;
          local_934 = 0;
          local_930 = 0;
          local_928 = 0;
          local_960 = 0;
          local_530 = (long *)(in_RDI + 0xe8);
          local_538 = (long)local_918;
          local_96c = local_8b4 * *(float *)(*local_530 + local_538 * 4);
          for (local_970 = 0; local_970 < local_7ec; local_970 = local_970 + 1) {
            *(float *)(local_920 + (long)local_970 * 4) =
                 *(float *)(local_920 + (long)local_970 * 4) * local_96c;
          }
          local_378 = local_780;
          local_1b8 = local_920;
          local_948 = local_1d0;
        }
      }
      else {
        local_520 = (undefined8 *)(in_RDI + 0xe8);
        local_528 = 0;
        local_8bc = local_8b4 * *(float *)*local_520;
        for (local_8c0 = 0; local_8c0 < local_7dc; local_8c0 = local_8c0 + 1) {
          local_620 = &local_910;
          local_1dc = *(int *)((long)local_7c8 + 0x2c);
          local_1e0 = (int)local_7c8[6];
          local_1e4 = *(undefined4 *)((long)local_7c8 + 0x34);
          local_8c8 = *local_7c8 + local_7c8[8] * (long)local_8c0 * local_7c8[2];
          local_1f8 = local_7c8[2];
          local_1fc = (undefined4)local_7c8[3];
          local_208 = local_7c8[4];
          local_1d8 = &local_910;
          local_18 = (long)local_1dc * (long)local_1e0 * local_1f8;
          local_1c = 0x10;
          local_62c = local_8c0;
          local_62d = 1;
          local_4f8 = &local_910;
          local_790 = &local_910;
          local_910 = 0;
          local_900 = 0;
          local_8f8 = 0;
          local_8e8 = 0;
          local_8e4 = 0;
          local_8e0 = 0;
          local_8dc = 0;
          local_8d8 = 0;
          local_8d0 = 0;
          local_908 = 0;
          for (local_914 = 0; local_914 < local_7ec; local_914 = local_914 + 1) {
            *(float *)(local_8c8 + (long)local_914 * 4) =
                 *(float *)(local_8c8 + (long)local_914 * 4) * local_8bc;
          }
          local_358 = local_790;
          local_1f0 = local_8c8;
          local_8f0 = local_208;
        }
      }
      local_7b4 = 0;
    }
    else {
      local_7b4 = -100;
    }
    local_848 = 1;
    local_770 = &local_838;
    if (local_830 != (int *)0x0) {
      local_39c = 0xffffffff;
      LOCK();
      local_3a0 = *local_830;
      *local_830 = *local_830 + -1;
      UNLOCK();
      if (local_3a0 == 1) {
        local_398 = local_770;
        if (local_818 == (long *)0x0) {
          local_300 = local_838;
          if (local_838 != (void *)0x0) {
            free(local_838);
          }
        }
        else {
          (**(code **)(*local_818 + 0x18))(local_818,local_838);
        }
      }
    }
  }
  return local_7b4;
}

Assistant:

int Normalize::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    if (across_spatial && across_channel)
    {
        // square
        Mat square_sum_blob;
        square_sum_blob.create(channels, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i = 0; i < size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            square_sum_blob[q] = ssum;
        }

        float ssum = 0.f;
        for (int q = 0; q < channels; q++)
        {
            ssum += square_sum_blob[q];
        }

        float a;
        if (eps_mode == 0) // caffe/mxnet
        {
            a = 1.f / sqrtf(ssum + eps);
        }
        else if (eps_mode == 1) // pytorch
        {
            a = 1.f / std::max(sqrtf(ssum), eps);
        }
        else //if (eps_mode == 2) // tensorflow
        {
            a = 1.f / sqrt(std::max(ssum, eps));
        }

        if (channel_shared)
        {
            float scale = a * scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = a * scale_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }

        return 0;
    }

    if (across_spatial && !across_channel)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i = 0; i < size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            float a;
            if (eps_mode == 0) // caffe/mxnet
            {
                a = 1.f / sqrtf(ssum + eps);
            }
            else if (eps_mode == 1) // pytorch
            {
                a = 1.f / std::max(sqrtf(ssum), eps);
            }
            else //if (eps_mode == 2) // tensorflow
            {
                a = 1.f / sqrtf(std::max(ssum, eps));
            }

            float scale = a * (channel_shared ? scale_data[0] : scale_data[q]);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = ptr[i] * scale;
            }
        }

        return 0;
    }

    if (!across_spatial && across_channel)
    {
        // square sum, 1 / sqrt(ssum)
        Mat square_sum_blob;
        square_sum_blob.create(size, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        if (channel_shared)
        {
            float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
            {
                float ssum = 0.f;
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = 1.f / sqrtf(ssum + eps);
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max((float)sqrt(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = 1.f / sqrtf(std::max(ssum, eps));
                }

                square_sum_blob[i] = a * scale;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i];
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
            {
                float ssum = 0.f;
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = 1.f / sqrtf(ssum + eps);
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max(sqrtf(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = 1.f / sqrtf(std::max(ssum, eps));
                }

                square_sum_blob[i] = a;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = scale_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i] * scale;
                }
            }
        }

        return 0;
    }

    return 0;
}